

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O3

bool spvtools::val::ValidateConstructSize(ConstructType type,size_t size)

{
  bool bVar1;
  
  switch(type) {
  case kSelection:
    bVar1 = size == 0;
    break;
  case kContinue:
  case kLoop:
    bVar1 = size == 1;
    break;
  case kCase:
    return size != 0;
  default:
    __assert_fail("1 == 0 && \"Type not defined\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/construct.cpp"
                  ,0x35,"bool spvtools::val::ValidateConstructSize(ConstructType, size_t)");
  }
  return bVar1;
}

Assistant:

bool ValidateConstructSize(ConstructType type, size_t size) {
  switch (type) {
    case ConstructType::kSelection:
      return size == 0;
    case ConstructType::kContinue:
      return size == 1;
    case ConstructType::kLoop:
      return size == 1;
    case ConstructType::kCase:
      return size >= 1;
    default:
      assert(1 == 0 && "Type not defined");
  }
  return false;
}